

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

vector<Lit,_std::allocator<Lit>_> * __thiscall
GraphPropagator::fullExpl
          (vector<Lit,_std::allocator<Lit>_> *__return_storage_ptr__,GraphPropagator *this,bool fail
          )

{
  BoolView *pBVar1;
  Lit LVar2;
  undefined8 in_RAX;
  undefined3 in_register_00000011;
  int i;
  long lVar3;
  long lVar4;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  if (CONCAT31(in_register_00000011,fail) == 0) {
    std::vector<Lit,_std::allocator<Lit>_>::emplace_back<>(__return_storage_ptr__);
  }
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (int)(this->vs).sz; lVar3 = lVar3 + 1) {
    pBVar1 = (this->vs).data;
    if (sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar4)] != '\0') {
      LVar2 = BoolView::getValLit((BoolView *)
                                  ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching +
                                  lVar4));
      local_38 = CONCAT44(LVar2.x,local_38._0_4_);
      std::vector<Lit,_std::allocator<Lit>_>::emplace_back<Lit>
                (__return_storage_ptr__,(Lit *)((long)&local_38 + 4));
    }
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (int)(this->es).sz; lVar3 = lVar3 + 1) {
    pBVar1 = (this->es).data;
    if (sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar4)] != '\0') {
      LVar2 = BoolView::getValLit((BoolView *)
                                  ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching +
                                  lVar4));
      local_38 = CONCAT44(local_38._4_4_,LVar2.x);
      std::vector<Lit,_std::allocator<Lit>_>::emplace_back<Lit>
                (__return_storage_ptr__,(Lit *)&local_38);
    }
    lVar4 = lVar4 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Lit> GraphPropagator::fullExpl(bool fail) {
	std::vector<Lit> ps;
	if (!fail) {
		ps.emplace_back();
	}
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push_back(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push_back(getEdgeVar(i).getValLit());
		}
	}
	return ps;
}